

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QMap<QString,_QVariant>_>::reallocateAndGrow
          (QArrayDataPointer<QMap<QString,_QVariant>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMap<QString,_QVariant>_> *old)

{
  QArrayData *pQVar1;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar2;
  Data *pDVar3;
  QMap<QString,_QVariant> *pQVar4;
  qsizetype qVar5;
  long lVar6;
  QMap<QString,_QVariant> *pQVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QArrayDataPointer<QMap<QString,_QVariant>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QMap<QString,_QVariant>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar8 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,8,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3),
                        Grow);
    this->d = (Data *)auVar8._0_8_;
    this->ptr = (QMap<QString,_QVariant> *)auVar8._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QMap<QString,_QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QMap<QString,_QVariant>_> *)0x0))
         || (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar6 != 0) && (0 < lVar6)) {
          pQVar7 = this->ptr;
          pQVar4 = pQVar7 + lVar6;
          do {
            pQVar2 = (pQVar7->d).d.ptr;
            local_38.ptr[local_38.size].d.d.ptr = pQVar2;
            if (pQVar2 != (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                           *)0x0) {
              LOCK();
              (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value =
                   (Type)((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
              UNLOCK();
            }
            pQVar7 = pQVar7 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar7 < pQVar4);
        }
      }
      else if ((lVar6 != 0) && (0 < lVar6)) {
        pQVar7 = this->ptr;
        pQVar4 = pQVar7 + lVar6;
        do {
          pQVar2 = (pQVar7->d).d.ptr;
          (pQVar7->d).d.ptr =
               (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                *)0x0;
          local_38.ptr[local_38.size].d.d.ptr = pQVar2;
          pQVar7 = pQVar7 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar7 < pQVar4);
      }
    }
    pDVar3 = this->d;
    pQVar4 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    qVar5 = this->size;
    this->size = local_38.size;
    local_38.d = pDVar3;
    local_38.ptr = pQVar4;
    local_38.size = qVar5;
    if (old != (QArrayDataPointer<QMap<QString,_QVariant>_> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pQVar4;
      local_38.size = old->size;
      old->size = qVar5;
    }
    ~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }